

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob.cc
# Opt level: O1

vector<int,_std::allocator<int>_> * __thiscall
QPDFJob::parseNumrange
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,QPDFJob *this,char *range,
          int max)

{
  QUtil::parse_numrange(__return_storage_ptr__,range,max);
  return __return_storage_ptr__;
}

Assistant:

std::vector<int>
QPDFJob::parseNumrange(char const* range, int max)
{
    try {
        return QUtil::parse_numrange(range, max);
    } catch (std::runtime_error& e) {
        usage(e.what());
    }
    return {};
}